

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pospopcnt.c
# Opt level: O0

int pospopcnt_u16_avx512bw_harley_seal(uint16_t *array,uint32_t len,uint32_t *flags)

{
  __m512i c;
  __m512i c_00;
  __m512i c_01;
  __m512i c_02;
  __m512i c_03;
  __m512i c_04;
  __m512i c_05;
  __m512i c_06;
  __m512i c_07;
  __m512i c_08;
  __m512i c_09;
  __m512i c_10;
  __m512i c_11;
  __m512i c_12;
  __m512i c_13;
  __m512i b;
  __m512i b_00;
  __m512i b_01;
  __m512i b_02;
  __m512i b_03;
  __m512i b_04;
  __m512i b_05;
  __m512i b_06;
  __m512i b_07;
  __m512i b_08;
  __m512i b_09;
  __m512i b_10;
  __m512i b_11;
  __m512i b_12;
  __m512i b_13;
  longlong *l;
  long in_RDX;
  uint in_ESI;
  long in_RDI;
  undefined1 auVar1 [64];
  undefined1 auVar2 [64];
  undefined1 auVar3 [64];
  undefined1 auVar4 [64];
  int j_4;
  size_t i_8;
  int j_3;
  size_t i_7;
  int j_2;
  size_t i_6;
  int j_1;
  size_t i_5;
  size_t z;
  size_t i_4;
  size_t i_3;
  size_t thislimit;
  size_t i_2;
  uint64_t i;
  uint16_t buffer [32];
  uint64_t limit;
  size_t size;
  __m512i counter [16];
  __m512i eightsB;
  __m512i eightsA;
  __m512i foursB;
  __m512i foursA;
  __m512i twosB;
  __m512i twosA;
  __m512i v16;
  __m512i v8;
  __m512i v4;
  __m512i v2;
  __m512i v1;
  __m512i *data;
  int j;
  uint32_t i_1;
  undefined8 in_stack_ffffffffffffd180;
  undefined1 *in_stack_ffffffffffffd188;
  undefined1 *puVar5;
  undefined1 *in_stack_ffffffffffffd198;
  undefined1 *puVar6;
  undefined1 *in_stack_ffffffffffffd1a8;
  undefined1 *in_stack_ffffffffffffd1b0;
  undefined1 *in_stack_ffffffffffffd1b8;
  undefined4 in_stack_ffffffffffffd1c0;
  undefined4 in_stack_ffffffffffffd1c4;
  undefined8 in_stack_ffffffffffffd1c8;
  undefined4 in_stack_ffffffffffffd1d0;
  undefined4 in_stack_ffffffffffffd1d4;
  undefined8 in_stack_ffffffffffffd1d8;
  undefined4 in_stack_ffffffffffffd1e0;
  undefined4 in_stack_ffffffffffffd1e4;
  undefined8 in_stack_ffffffffffffd1e8;
  ulong uVar7;
  undefined4 in_stack_ffffffffffffd1f0;
  undefined4 in_stack_ffffffffffffd1f4;
  int iVar8;
  ulong local_2e08;
  ulong local_2e00;
  ulong local_2df8;
  ulong local_2df0;
  __m512i *h;
  longlong *local_2dd8;
  undefined1 local_2dd0 [64];
  longlong *local_2d90;
  ulong local_2d88;
  undefined1 local_2d80 [64];
  undefined1 local_2d40 [64];
  undefined1 local_2d00 [64];
  undefined1 local_2cc0 [64];
  undefined1 local_2c80 [64];
  undefined1 local_2c40 [64];
  undefined1 local_2c00 [64];
  undefined1 local_2bc0 [64];
  undefined1 local_2b80 [64];
  undefined1 local_2b40 [64];
  undefined1 local_2b00 [64];
  undefined1 local_2ac0 [64];
  undefined1 local_2a80 [64];
  undefined1 local_2a40 [64];
  undefined1 local_2a00 [64];
  undefined1 local_29c0 [64];
  undefined1 local_2980 [64];
  undefined1 local_2940 [64];
  undefined1 local_2900 [64];
  undefined1 local_28c0 [64];
  undefined1 local_2880 [64];
  undefined1 local_2840 [64];
  undefined1 local_2800 [64];
  undefined1 local_27c0 [64];
  undefined1 local_2780 [64];
  undefined1 local_2740 [64];
  undefined1 local_2700 [64];
  long local_26b0;
  int local_26a8;
  uint local_26a4;
  long local_26a0;
  undefined1 (*local_2688) [64];
  undefined1 (*local_2680) [64];
  undefined1 (*local_2678) [64];
  undefined1 (*local_2670) [64];
  undefined1 (*local_2668) [64];
  undefined1 (*local_2660) [64];
  undefined1 (*local_2658) [64];
  undefined1 (*local_2650) [64];
  undefined1 (*local_2648) [64];
  undefined1 (*local_2640) [64];
  undefined1 (*local_2638) [64];
  undefined1 (*local_2630) [64];
  undefined1 (*local_2628) [64];
  undefined1 (*local_2620) [64];
  undefined1 (*local_2618) [64];
  undefined1 (*local_2610) [64];
  undefined4 local_2604;
  undefined1 local_2600 [64];
  undefined4 local_2584;
  undefined1 local_2580 [64];
  undefined4 local_2504;
  undefined1 local_2500 [64];
  undefined4 local_2484;
  undefined1 local_2480 [64];
  undefined4 local_2404;
  undefined1 local_2400 [64];
  undefined4 local_2384;
  undefined1 local_2380 [64];
  undefined4 local_2304;
  undefined1 local_2300 [64];
  undefined4 local_2284;
  undefined1 local_2280 [64];
  undefined4 local_2204;
  undefined1 local_2200 [64];
  undefined4 local_2184;
  undefined1 local_2180 [64];
  undefined4 local_2104;
  undefined1 local_2100 [64];
  undefined4 local_2084;
  undefined1 local_2080 [64];
  undefined4 local_2004;
  undefined1 local_2000 [64];
  undefined4 local_1f84;
  undefined1 local_1f80 [64];
  undefined4 local_1f04;
  undefined1 local_1f00 [64];
  undefined4 local_1e84;
  undefined1 local_1e80 [64];
  undefined4 local_1e04;
  undefined1 local_1e00 [64];
  undefined1 local_1dc0 [64];
  undefined1 local_1d80 [64];
  undefined1 local_1d40 [64];
  undefined1 local_1d00 [64];
  undefined1 local_1cc0 [64];
  undefined1 local_1c80 [64];
  undefined1 local_1c40 [64];
  undefined1 local_1c00 [64];
  undefined1 local_1bc0 [64];
  undefined1 local_1b80 [64];
  undefined1 local_1b40 [64];
  undefined1 local_1b00 [64];
  undefined1 local_1ac0 [64];
  undefined1 local_1a80 [64];
  undefined1 local_1a40 [64];
  undefined1 local_1a00 [64];
  undefined1 local_19c0 [64];
  undefined1 local_1980 [64];
  undefined1 local_1940 [64];
  undefined1 local_1900 [64];
  undefined1 local_18c0 [64];
  undefined1 local_1880 [64];
  undefined1 local_1840 [64];
  undefined1 local_1800 [64];
  undefined1 local_17c0 [64];
  undefined1 local_1780 [64];
  undefined1 local_1740 [64];
  undefined1 local_1700 [64];
  undefined1 local_16c0 [64];
  undefined1 local_1680 [64];
  undefined1 local_1640 [64];
  undefined1 local_1600 [64];
  undefined1 local_15c0 [64];
  undefined1 local_1580 [64];
  undefined1 local_1540 [64];
  undefined2 local_14c2;
  undefined1 local_14c0 [64];
  undefined2 local_1442;
  undefined1 local_1440 [64];
  undefined2 local_13c2;
  undefined1 local_13c0 [64];
  undefined2 local_1342;
  undefined1 local_1340 [64];
  undefined2 local_12c2;
  undefined1 local_12c0 [64];
  undefined2 local_1242;
  undefined1 local_1240 [64];
  undefined2 local_11c2;
  undefined1 local_11c0 [64];
  undefined2 local_1142;
  undefined1 local_1140 [64];
  undefined2 local_10c2;
  undefined1 local_10c0 [64];
  undefined2 local_1042;
  undefined1 local_1040 [64];
  undefined2 local_fc2;
  undefined1 local_fc0 [64];
  undefined2 local_f42;
  undefined1 local_f40 [64];
  undefined2 local_ec2;
  undefined1 local_ec0 [64];
  undefined2 local_e42;
  undefined1 local_e40 [64];
  undefined2 local_dc2;
  undefined1 local_dc0 [64];
  undefined2 local_d42;
  undefined1 local_d40 [64];
  undefined2 local_cc2;
  undefined1 local_cc0 [64];
  undefined1 local_c80 [64];
  undefined1 local_c40 [64];
  undefined1 local_c00 [64];
  undefined1 local_bc0 [64];
  undefined1 local_b80 [64];
  undefined1 local_b40 [64];
  undefined1 local_b00 [64];
  undefined1 local_ac0 [64];
  undefined1 local_a80 [64];
  undefined1 local_a40 [64];
  undefined1 local_a00 [64];
  undefined1 local_9c0 [64];
  undefined1 local_980 [64];
  undefined1 local_940 [64];
  undefined1 local_900 [64];
  undefined1 local_8c0 [64];
  undefined1 local_880 [64];
  undefined1 local_840 [64];
  undefined1 local_800 [64];
  undefined1 local_7c0 [64];
  undefined1 local_780 [64];
  undefined1 local_740 [64];
  undefined1 local_700 [64];
  undefined1 local_6c0 [64];
  undefined1 local_680 [64];
  undefined1 local_640 [64];
  undefined1 local_600 [64];
  undefined1 local_5c0 [64];
  undefined1 local_580 [64];
  undefined1 local_540 [64];
  undefined1 local_500 [64];
  undefined1 local_4c0 [64];
  undefined1 local_480 [64];
  undefined1 local_440 [64];
  undefined1 local_400 [64];
  undefined1 local_3c0 [64];
  undefined1 local_380 [64];
  undefined1 local_340 [64];
  undefined1 local_300 [64];
  undefined1 local_c0 [64];
  undefined1 *local_58;
  
  for (local_26a4 = in_ESI - (in_ESI & 0x1ff); local_26a4 < in_ESI; local_26a4 = local_26a4 + 1) {
    for (local_26a8 = 0; local_26a8 < 0x10; local_26a8 = local_26a8 + 1) {
      *(int *)(in_RDX + (long)local_26a8 * 4) =
           ((int)((uint)*(ushort *)(in_RDI + (ulong)local_26a4 * 2) & 1 << ((byte)local_26a8 & 0x1f)
                 ) >> ((byte)local_26a8 & 0x1f)) + *(int *)(in_RDX + (long)local_26a8 * 4);
    }
  }
  auVar4 = ZEXT1664((undefined1  [16])0x0);
  local_b80 = vmovdqa64_avx512f(auVar4);
  auVar1 = vmovdqa64_avx512f(local_b80);
  local_2700 = vmovdqa64_avx512f(auVar1);
  local_bc0 = vmovdqa64_avx512f(auVar4);
  auVar1 = vmovdqa64_avx512f(local_bc0);
  local_2740 = vmovdqa64_avx512f(auVar1);
  local_c00 = vmovdqa64_avx512f(auVar4);
  auVar1 = vmovdqa64_avx512f(local_c00);
  local_2780 = vmovdqa64_avx512f(auVar1);
  local_c40 = vmovdqa64_avx512f(auVar4);
  auVar1 = vmovdqa64_avx512f(local_c40);
  local_27c0 = vmovdqa64_avx512f(auVar1);
  local_c80 = vmovdqa64_avx512f(auVar4);
  auVar1 = vmovdqa64_avx512f(local_c80);
  local_2800 = vmovdqa64_avx512f(auVar1);
  local_2d88 = (ulong)(in_ESI >> 5);
  local_2d90 = (longlong *)(local_2d88 - (local_2d88 & 0xf));
  local_2dd8 = (longlong *)0x0;
  local_26b0 = in_RDI;
  local_26a0 = in_RDX;
  while (local_2dd8 < local_2d90) {
    for (h = (__m512i *)0x0; h < (__m512i *)0x10; h = (__m512i *)((long)*h + 1)) {
      local_cc0 = vmovdqa64_avx512f(ZEXT1664((undefined1  [16])0x0));
      auVar1 = vmovdqa64_avx512f(local_cc0);
      auVar1 = vmovdqa64_avx512f(auVar1);
      *(undefined1 (*) [64])(local_2d80 + (long)h * 0x40) = auVar1;
    }
    l = local_2d90;
    if (0xffff < (ulong)((long)local_2d90 - (long)local_2dd8)) {
      l = (longlong *)((long)local_2dd8 + 0xffff);
    }
    for (; local_2dd8 < l; local_2dd8 = local_2dd8 + 2) {
      local_2610 = (undefined1 (*) [64])(local_26b0 + (long)local_2dd8 * 0x40);
      vmovdqu64_avx512f(*local_2610);
      local_2618 = (undefined1 (*) [64])(local_26b0 + 0x40 + (long)local_2dd8 * 0x40);
      vmovdqu64_avx512f(*local_2618);
      puVar5 = local_2840;
      puVar6 = local_2700;
      b[1]._0_4_ = in_stack_ffffffffffffd1c0;
      b[0] = (longlong)in_stack_ffffffffffffd1b8;
      b[1]._4_4_ = in_stack_ffffffffffffd1c4;
      b[2] = in_stack_ffffffffffffd1c8;
      b[3]._0_4_ = in_stack_ffffffffffffd1d0;
      b[3]._4_4_ = in_stack_ffffffffffffd1d4;
      b[4] = in_stack_ffffffffffffd1d8;
      b[5]._0_4_ = in_stack_ffffffffffffd1e0;
      b[5]._4_4_ = in_stack_ffffffffffffd1e4;
      b[6] = in_stack_ffffffffffffd1e8;
      b[7]._0_4_ = in_stack_ffffffffffffd1f0;
      b[7]._4_4_ = in_stack_ffffffffffffd1f4;
      c[1] = in_stack_ffffffffffffd180;
      c[0] = 0x1501e1;
      c[2] = (longlong)in_stack_ffffffffffffd188;
      c[3] = (longlong)puVar5;
      c[4] = (longlong)in_stack_ffffffffffffd198;
      c[5] = (longlong)puVar6;
      c[6] = (longlong)in_stack_ffffffffffffd1a8;
      c[7] = (longlong)in_stack_ffffffffffffd1b0;
      pospopcnt_csa_avx512(h,(__m512i *)l,b,c);
      local_2620 = (undefined1 (*) [64])(local_26b0 + 0x80 + (long)local_2dd8 * 0x40);
      vmovdqu64_avx512f(*local_2620);
      local_2628 = (undefined1 (*) [64])(local_26b0 + 0xc0 + (long)local_2dd8 * 0x40);
      vmovdqu64_avx512f(*local_2628);
      in_stack_ffffffffffffd198 = local_2880;
      b_00[1]._0_4_ = in_stack_ffffffffffffd1c0;
      b_00[0] = (longlong)in_stack_ffffffffffffd1b8;
      b_00[1]._4_4_ = in_stack_ffffffffffffd1c4;
      b_00[2] = in_stack_ffffffffffffd1c8;
      b_00[3]._0_4_ = in_stack_ffffffffffffd1d0;
      b_00[3]._4_4_ = in_stack_ffffffffffffd1d4;
      b_00[4] = in_stack_ffffffffffffd1d8;
      b_00[5]._0_4_ = in_stack_ffffffffffffd1e0;
      b_00[5]._4_4_ = in_stack_ffffffffffffd1e4;
      b_00[6] = in_stack_ffffffffffffd1e8;
      b_00[7]._0_4_ = in_stack_ffffffffffffd1f0;
      b_00[7]._4_4_ = in_stack_ffffffffffffd1f4;
      c_00[1] = in_stack_ffffffffffffd180;
      c_00[0] = 0x15025c;
      c_00[2] = (longlong)in_stack_ffffffffffffd188;
      c_00[3] = (longlong)puVar5;
      c_00[4] = (longlong)in_stack_ffffffffffffd198;
      c_00[5] = (longlong)puVar6;
      c_00[6] = (longlong)in_stack_ffffffffffffd1a8;
      c_00[7] = (longlong)in_stack_ffffffffffffd1b0;
      pospopcnt_csa_avx512(h,(__m512i *)l,b_00,c_00);
      vmovdqa64_avx512f(local_2840);
      vmovdqa64_avx512f(local_2880);
      in_stack_ffffffffffffd188 = local_28c0;
      in_stack_ffffffffffffd1b0 = local_2740;
      b_01[1]._0_4_ = in_stack_ffffffffffffd1c0;
      b_01[0] = (longlong)in_stack_ffffffffffffd1b8;
      b_01[1]._4_4_ = in_stack_ffffffffffffd1c4;
      b_01[2] = in_stack_ffffffffffffd1c8;
      b_01[3]._0_4_ = in_stack_ffffffffffffd1d0;
      b_01[3]._4_4_ = in_stack_ffffffffffffd1d4;
      b_01[4] = in_stack_ffffffffffffd1d8;
      b_01[5]._0_4_ = in_stack_ffffffffffffd1e0;
      b_01[5]._4_4_ = in_stack_ffffffffffffd1e4;
      b_01[6] = in_stack_ffffffffffffd1e8;
      b_01[7]._0_4_ = in_stack_ffffffffffffd1f0;
      b_01[7]._4_4_ = in_stack_ffffffffffffd1f4;
      c_01[1] = in_stack_ffffffffffffd180;
      c_01[0] = 0x15028b;
      c_01[2] = (longlong)in_stack_ffffffffffffd188;
      c_01[3] = (longlong)puVar5;
      c_01[4] = (longlong)in_stack_ffffffffffffd198;
      c_01[5] = (longlong)puVar6;
      c_01[6] = (longlong)in_stack_ffffffffffffd1a8;
      c_01[7] = (longlong)in_stack_ffffffffffffd1b0;
      pospopcnt_csa_avx512(h,(__m512i *)l,b_01,c_01);
      local_2630 = (undefined1 (*) [64])(local_26b0 + 0x100 + (long)local_2dd8 * 0x40);
      vmovdqu64_avx512f(*local_2630);
      local_2638 = (undefined1 (*) [64])(local_26b0 + 0x140 + (long)local_2dd8 * 0x40);
      vmovdqu64_avx512f(*local_2638);
      b_02[1]._0_4_ = in_stack_ffffffffffffd1c0;
      b_02[0] = (longlong)in_stack_ffffffffffffd1b8;
      b_02[1]._4_4_ = in_stack_ffffffffffffd1c4;
      b_02[2] = in_stack_ffffffffffffd1c8;
      b_02[3]._0_4_ = in_stack_ffffffffffffd1d0;
      b_02[3]._4_4_ = in_stack_ffffffffffffd1d4;
      b_02[4] = in_stack_ffffffffffffd1d8;
      b_02[5]._0_4_ = in_stack_ffffffffffffd1e0;
      b_02[5]._4_4_ = in_stack_ffffffffffffd1e4;
      b_02[6] = in_stack_ffffffffffffd1e8;
      b_02[7]._0_4_ = in_stack_ffffffffffffd1f0;
      b_02[7]._4_4_ = in_stack_ffffffffffffd1f4;
      c_02[1] = in_stack_ffffffffffffd180;
      c_02[0] = 0x1502fe;
      c_02[2] = (longlong)in_stack_ffffffffffffd188;
      c_02[3] = (longlong)puVar5;
      c_02[4] = (longlong)in_stack_ffffffffffffd198;
      c_02[5] = (longlong)puVar6;
      c_02[6] = (longlong)in_stack_ffffffffffffd1a8;
      c_02[7] = (longlong)in_stack_ffffffffffffd1b0;
      pospopcnt_csa_avx512(h,(__m512i *)l,b_02,c_02);
      local_2640 = (undefined1 (*) [64])(local_26b0 + 0x180 + (long)local_2dd8 * 0x40);
      vmovdqu64_avx512f(*local_2640);
      local_2648 = (undefined1 (*) [64])(local_26b0 + 0x1c0 + (long)local_2dd8 * 0x40);
      vmovdqu64_avx512f(*local_2648);
      b_03[1]._0_4_ = in_stack_ffffffffffffd1c0;
      b_03[0] = (longlong)in_stack_ffffffffffffd1b8;
      b_03[1]._4_4_ = in_stack_ffffffffffffd1c4;
      b_03[2] = in_stack_ffffffffffffd1c8;
      b_03[3]._0_4_ = in_stack_ffffffffffffd1d0;
      b_03[3]._4_4_ = in_stack_ffffffffffffd1d4;
      b_03[4] = in_stack_ffffffffffffd1d8;
      b_03[5]._0_4_ = in_stack_ffffffffffffd1e0;
      b_03[5]._4_4_ = in_stack_ffffffffffffd1e4;
      b_03[6] = in_stack_ffffffffffffd1e8;
      b_03[7]._0_4_ = in_stack_ffffffffffffd1f0;
      b_03[7]._4_4_ = in_stack_ffffffffffffd1f4;
      c_03[1] = in_stack_ffffffffffffd180;
      c_03[0] = 0x150371;
      c_03[2] = (longlong)in_stack_ffffffffffffd188;
      c_03[3] = (longlong)puVar5;
      c_03[4] = (longlong)in_stack_ffffffffffffd198;
      c_03[5] = (longlong)puVar6;
      c_03[6] = (longlong)in_stack_ffffffffffffd1a8;
      c_03[7] = (longlong)in_stack_ffffffffffffd1b0;
      pospopcnt_csa_avx512(h,(__m512i *)l,b_03,c_03);
      vmovdqa64_avx512f(local_2840);
      vmovdqa64_avx512f(local_2880);
      in_stack_ffffffffffffd1a8 = local_2900;
      b_04[1]._0_4_ = in_stack_ffffffffffffd1c0;
      b_04[0] = (longlong)in_stack_ffffffffffffd1b8;
      b_04[1]._4_4_ = in_stack_ffffffffffffd1c4;
      b_04[2] = in_stack_ffffffffffffd1c8;
      b_04[3]._0_4_ = in_stack_ffffffffffffd1d0;
      b_04[3]._4_4_ = in_stack_ffffffffffffd1d4;
      b_04[4] = in_stack_ffffffffffffd1d8;
      b_04[5]._0_4_ = in_stack_ffffffffffffd1e0;
      b_04[5]._4_4_ = in_stack_ffffffffffffd1e4;
      b_04[6] = in_stack_ffffffffffffd1e8;
      b_04[7]._0_4_ = in_stack_ffffffffffffd1f0;
      b_04[7]._4_4_ = in_stack_ffffffffffffd1f4;
      c_04[1] = in_stack_ffffffffffffd180;
      c_04[0] = 0x150398;
      c_04[2] = (longlong)in_stack_ffffffffffffd188;
      c_04[3] = (longlong)puVar5;
      c_04[4] = (longlong)in_stack_ffffffffffffd198;
      c_04[5] = (longlong)puVar6;
      c_04[6] = (longlong)in_stack_ffffffffffffd1a8;
      c_04[7] = (longlong)in_stack_ffffffffffffd1b0;
      pospopcnt_csa_avx512(h,(__m512i *)l,b_04,c_04);
      vmovdqa64_avx512f(local_28c0);
      vmovdqa64_avx512f(local_2900);
      in_stack_ffffffffffffd1b8 = local_2780;
      b_05[1]._0_4_ = in_stack_ffffffffffffd1c0;
      b_05[0] = (longlong)in_stack_ffffffffffffd1b8;
      b_05[1]._4_4_ = in_stack_ffffffffffffd1c4;
      b_05[2] = in_stack_ffffffffffffd1c8;
      b_05[3]._0_4_ = in_stack_ffffffffffffd1d0;
      b_05[3]._4_4_ = in_stack_ffffffffffffd1d4;
      b_05[4] = in_stack_ffffffffffffd1d8;
      b_05[5]._0_4_ = in_stack_ffffffffffffd1e0;
      b_05[5]._4_4_ = in_stack_ffffffffffffd1e4;
      b_05[6] = in_stack_ffffffffffffd1e8;
      b_05[7]._0_4_ = in_stack_ffffffffffffd1f0;
      b_05[7]._4_4_ = in_stack_ffffffffffffd1f4;
      c_05[1] = in_stack_ffffffffffffd180;
      c_05[0] = 0x1503c2;
      c_05[2] = (longlong)in_stack_ffffffffffffd188;
      c_05[3] = (longlong)puVar5;
      c_05[4] = (longlong)in_stack_ffffffffffffd198;
      c_05[5] = (longlong)puVar6;
      c_05[6] = (longlong)in_stack_ffffffffffffd1a8;
      c_05[7] = (longlong)in_stack_ffffffffffffd1b0;
      pospopcnt_csa_avx512(h,(__m512i *)l,b_05,c_05);
      local_2650 = (undefined1 (*) [64])(local_26b0 + 0x200 + (long)local_2dd8 * 0x40);
      vmovdqu64_avx512f(*local_2650);
      local_2658 = (undefined1 (*) [64])(local_26b0 + 0x240 + (long)local_2dd8 * 0x40);
      vmovdqu64_avx512f(*local_2658);
      b_06[1]._0_4_ = in_stack_ffffffffffffd1c0;
      b_06[0] = (longlong)in_stack_ffffffffffffd1b8;
      b_06[1]._4_4_ = in_stack_ffffffffffffd1c4;
      b_06[2] = in_stack_ffffffffffffd1c8;
      b_06[3]._0_4_ = in_stack_ffffffffffffd1d0;
      b_06[3]._4_4_ = in_stack_ffffffffffffd1d4;
      b_06[4] = in_stack_ffffffffffffd1d8;
      b_06[5]._0_4_ = in_stack_ffffffffffffd1e0;
      b_06[5]._4_4_ = in_stack_ffffffffffffd1e4;
      b_06[6] = in_stack_ffffffffffffd1e8;
      b_06[7]._0_4_ = in_stack_ffffffffffffd1f0;
      b_06[7]._4_4_ = in_stack_ffffffffffffd1f4;
      c_06[1] = in_stack_ffffffffffffd180;
      c_06[0] = 0x150435;
      c_06[2] = (longlong)in_stack_ffffffffffffd188;
      c_06[3] = (longlong)puVar5;
      c_06[4] = (longlong)in_stack_ffffffffffffd198;
      c_06[5] = (longlong)puVar6;
      c_06[6] = (longlong)in_stack_ffffffffffffd1a8;
      c_06[7] = (longlong)in_stack_ffffffffffffd1b0;
      pospopcnt_csa_avx512(h,(__m512i *)l,b_06,c_06);
      local_2660 = (undefined1 (*) [64])(local_26b0 + 0x280 + (long)local_2dd8 * 0x40);
      vmovdqu64_avx512f(*local_2660);
      local_2668 = (undefined1 (*) [64])(local_26b0 + 0x2c0 + (long)local_2dd8 * 0x40);
      vmovdqu64_avx512f(*local_2668);
      b_07[1]._0_4_ = in_stack_ffffffffffffd1c0;
      b_07[0] = (longlong)in_stack_ffffffffffffd1b8;
      b_07[1]._4_4_ = in_stack_ffffffffffffd1c4;
      b_07[2] = in_stack_ffffffffffffd1c8;
      b_07[3]._0_4_ = in_stack_ffffffffffffd1d0;
      b_07[3]._4_4_ = in_stack_ffffffffffffd1d4;
      b_07[4] = in_stack_ffffffffffffd1d8;
      b_07[5]._0_4_ = in_stack_ffffffffffffd1e0;
      b_07[5]._4_4_ = in_stack_ffffffffffffd1e4;
      b_07[6] = in_stack_ffffffffffffd1e8;
      b_07[7]._0_4_ = in_stack_ffffffffffffd1f0;
      b_07[7]._4_4_ = in_stack_ffffffffffffd1f4;
      c_07[1] = in_stack_ffffffffffffd180;
      c_07[0] = 0x1504a8;
      c_07[2] = (longlong)in_stack_ffffffffffffd188;
      c_07[3] = (longlong)puVar5;
      c_07[4] = (longlong)in_stack_ffffffffffffd198;
      c_07[5] = (longlong)puVar6;
      c_07[6] = (longlong)in_stack_ffffffffffffd1a8;
      c_07[7] = (longlong)in_stack_ffffffffffffd1b0;
      pospopcnt_csa_avx512(h,(__m512i *)l,b_07,c_07);
      vmovdqa64_avx512f(local_2840);
      vmovdqa64_avx512f(local_2880);
      b_08[1]._0_4_ = in_stack_ffffffffffffd1c0;
      b_08[0] = (longlong)in_stack_ffffffffffffd1b8;
      b_08[1]._4_4_ = in_stack_ffffffffffffd1c4;
      b_08[2] = in_stack_ffffffffffffd1c8;
      b_08[3]._0_4_ = in_stack_ffffffffffffd1d0;
      b_08[3]._4_4_ = in_stack_ffffffffffffd1d4;
      b_08[4] = in_stack_ffffffffffffd1d8;
      b_08[5]._0_4_ = in_stack_ffffffffffffd1e0;
      b_08[5]._4_4_ = in_stack_ffffffffffffd1e4;
      b_08[6] = in_stack_ffffffffffffd1e8;
      b_08[7]._0_4_ = in_stack_ffffffffffffd1f0;
      b_08[7]._4_4_ = in_stack_ffffffffffffd1f4;
      c_08[1] = in_stack_ffffffffffffd180;
      c_08[0] = 0x1504c7;
      c_08[2] = (longlong)in_stack_ffffffffffffd188;
      c_08[3] = (longlong)puVar5;
      c_08[4] = (longlong)in_stack_ffffffffffffd198;
      c_08[5] = (longlong)puVar6;
      c_08[6] = (longlong)in_stack_ffffffffffffd1a8;
      c_08[7] = (longlong)in_stack_ffffffffffffd1b0;
      pospopcnt_csa_avx512(h,(__m512i *)l,b_08,c_08);
      local_2670 = (undefined1 (*) [64])(local_26b0 + 0x300 + (long)local_2dd8 * 0x40);
      vmovdqu64_avx512f(*local_2670);
      local_2678 = (undefined1 (*) [64])(local_26b0 + 0x340 + (long)local_2dd8 * 0x40);
      vmovdqu64_avx512f(*local_2678);
      b_09[1]._0_4_ = in_stack_ffffffffffffd1c0;
      b_09[0] = (longlong)in_stack_ffffffffffffd1b8;
      b_09[1]._4_4_ = in_stack_ffffffffffffd1c4;
      b_09[2] = in_stack_ffffffffffffd1c8;
      b_09[3]._0_4_ = in_stack_ffffffffffffd1d0;
      b_09[3]._4_4_ = in_stack_ffffffffffffd1d4;
      b_09[4] = in_stack_ffffffffffffd1d8;
      b_09[5]._0_4_ = in_stack_ffffffffffffd1e0;
      b_09[5]._4_4_ = in_stack_ffffffffffffd1e4;
      b_09[6] = in_stack_ffffffffffffd1e8;
      b_09[7]._0_4_ = in_stack_ffffffffffffd1f0;
      b_09[7]._4_4_ = in_stack_ffffffffffffd1f4;
      c_09[1] = in_stack_ffffffffffffd180;
      c_09[0] = 0x15053a;
      c_09[2] = (longlong)in_stack_ffffffffffffd188;
      c_09[3] = (longlong)puVar5;
      c_09[4] = (longlong)in_stack_ffffffffffffd198;
      c_09[5] = (longlong)puVar6;
      c_09[6] = (longlong)in_stack_ffffffffffffd1a8;
      c_09[7] = (longlong)in_stack_ffffffffffffd1b0;
      pospopcnt_csa_avx512(h,(__m512i *)l,b_09,c_09);
      local_2680 = (undefined1 (*) [64])(local_26b0 + 0x380 + (long)local_2dd8 * 0x40);
      vmovdqu64_avx512f(*local_2680);
      local_2688 = (undefined1 (*) [64])(local_26b0 + 0x3c0 + (long)local_2dd8 * 0x40);
      vmovdqu64_avx512f(*local_2688);
      b_10[1]._0_4_ = in_stack_ffffffffffffd1c0;
      b_10[0] = (longlong)in_stack_ffffffffffffd1b8;
      b_10[1]._4_4_ = in_stack_ffffffffffffd1c4;
      b_10[2] = in_stack_ffffffffffffd1c8;
      b_10[3]._0_4_ = in_stack_ffffffffffffd1d0;
      b_10[3]._4_4_ = in_stack_ffffffffffffd1d4;
      b_10[4] = in_stack_ffffffffffffd1d8;
      b_10[5]._0_4_ = in_stack_ffffffffffffd1e0;
      b_10[5]._4_4_ = in_stack_ffffffffffffd1e4;
      b_10[6] = in_stack_ffffffffffffd1e8;
      b_10[7]._0_4_ = in_stack_ffffffffffffd1f0;
      b_10[7]._4_4_ = in_stack_ffffffffffffd1f4;
      c_10[1] = in_stack_ffffffffffffd180;
      c_10[0] = 0x1505ad;
      c_10[2] = (longlong)in_stack_ffffffffffffd188;
      c_10[3] = (longlong)puVar5;
      c_10[4] = (longlong)in_stack_ffffffffffffd198;
      c_10[5] = (longlong)puVar6;
      c_10[6] = (longlong)in_stack_ffffffffffffd1a8;
      c_10[7] = (longlong)in_stack_ffffffffffffd1b0;
      pospopcnt_csa_avx512(h,(__m512i *)l,b_10,c_10);
      vmovdqa64_avx512f(local_2840);
      vmovdqa64_avx512f(local_2880);
      b_11[1]._0_4_ = in_stack_ffffffffffffd1c0;
      b_11[0] = (longlong)in_stack_ffffffffffffd1b8;
      b_11[1]._4_4_ = in_stack_ffffffffffffd1c4;
      b_11[2] = in_stack_ffffffffffffd1c8;
      b_11[3]._0_4_ = in_stack_ffffffffffffd1d0;
      b_11[3]._4_4_ = in_stack_ffffffffffffd1d4;
      b_11[4] = in_stack_ffffffffffffd1d8;
      b_11[5]._0_4_ = in_stack_ffffffffffffd1e0;
      b_11[5]._4_4_ = in_stack_ffffffffffffd1e4;
      b_11[6] = in_stack_ffffffffffffd1e8;
      b_11[7]._0_4_ = in_stack_ffffffffffffd1f0;
      b_11[7]._4_4_ = in_stack_ffffffffffffd1f4;
      c_11[1] = in_stack_ffffffffffffd180;
      c_11[0] = 0x1505cc;
      c_11[2] = (longlong)in_stack_ffffffffffffd188;
      c_11[3] = (longlong)puVar5;
      c_11[4] = (longlong)in_stack_ffffffffffffd198;
      c_11[5] = (longlong)puVar6;
      c_11[6] = (longlong)in_stack_ffffffffffffd1a8;
      c_11[7] = (longlong)in_stack_ffffffffffffd1b0;
      pospopcnt_csa_avx512(h,(__m512i *)l,b_11,c_11);
      vmovdqa64_avx512f(local_28c0);
      vmovdqa64_avx512f(local_2900);
      b_12[1]._0_4_ = in_stack_ffffffffffffd1c0;
      b_12[0] = (longlong)in_stack_ffffffffffffd1b8;
      b_12[1]._4_4_ = in_stack_ffffffffffffd1c4;
      b_12[2] = in_stack_ffffffffffffd1c8;
      b_12[3]._0_4_ = in_stack_ffffffffffffd1d0;
      b_12[3]._4_4_ = in_stack_ffffffffffffd1d4;
      b_12[4] = in_stack_ffffffffffffd1d8;
      b_12[5]._0_4_ = in_stack_ffffffffffffd1e0;
      b_12[5]._4_4_ = in_stack_ffffffffffffd1e4;
      b_12[6] = in_stack_ffffffffffffd1e8;
      b_12[7]._0_4_ = in_stack_ffffffffffffd1f0;
      b_12[7]._4_4_ = in_stack_ffffffffffffd1f4;
      c_12[1] = in_stack_ffffffffffffd180;
      c_12[0] = 0x1505ee;
      c_12[2] = (longlong)in_stack_ffffffffffffd188;
      c_12[3] = (longlong)puVar5;
      c_12[4] = (longlong)in_stack_ffffffffffffd198;
      c_12[5] = (longlong)puVar6;
      c_12[6] = (longlong)in_stack_ffffffffffffd1a8;
      c_12[7] = (longlong)in_stack_ffffffffffffd1b0;
      pospopcnt_csa_avx512(h,(__m512i *)l,b_12,c_12);
      auVar1 = vmovdqa64_avx512f(local_2d80);
      auVar4 = vmovdqa64_avx512f(local_2800);
      local_cc2 = 1;
      auVar2 = vpbroadcastw_avx512bw(ZEXT216(1));
      local_d40 = vmovdqa64_avx512f(auVar2);
      auVar2 = vmovdqa64_avx512f(local_d40);
      local_1580 = vmovdqa64_avx512f(auVar4);
      local_15c0 = vmovdqa64_avx512f(auVar2);
      auVar4 = vmovdqa64_avx512f(local_1580);
      auVar2 = vmovdqa64_avx512f(local_15c0);
      auVar4 = vpandq_avx512f(auVar4,auVar2);
      local_300 = vmovdqa64_avx512f(auVar1);
      local_340 = vmovdqa64_avx512f(auVar4);
      auVar1 = vmovdqa64_avx512f(local_300);
      auVar4 = vmovdqa64_avx512f(local_340);
      auVar1 = vpaddw_avx512bw(auVar1,auVar4);
      local_2d80 = vmovdqa64_avx512f(auVar1);
      auVar1 = vmovdqa64_avx512f(local_2800);
      local_1e00 = vmovdqa64_avx512f(auVar1);
      local_1e04 = 1;
      auVar1 = vmovdqa64_avx512f(local_1e00);
      auVar1 = vpsrlw_avx512bw(auVar1,ZEXT416(1));
      auVar1 = vmovdqa64_avx512f(auVar1);
      auVar4 = vmovdqa64_avx512f(local_2d40);
      auVar2 = vmovdqa64_avx512f(auVar1);
      local_d42 = 1;
      auVar3 = vpbroadcastw_avx512bw(ZEXT216(1));
      local_dc0 = vmovdqa64_avx512f(auVar3);
      auVar3 = vmovdqa64_avx512f(local_dc0);
      local_1600 = vmovdqa64_avx512f(auVar2);
      local_1640 = vmovdqa64_avx512f(auVar3);
      auVar2 = vmovdqa64_avx512f(local_1600);
      auVar3 = vmovdqa64_avx512f(local_1640);
      auVar2 = vpandq_avx512f(auVar2,auVar3);
      local_380 = vmovdqa64_avx512f(auVar4);
      local_3c0 = vmovdqa64_avx512f(auVar2);
      auVar4 = vmovdqa64_avx512f(local_380);
      auVar2 = vmovdqa64_avx512f(local_3c0);
      auVar4 = vpaddw_avx512bw(auVar4,auVar2);
      local_2d40 = vmovdqa64_avx512f(auVar4);
      auVar1 = vmovdqa64_avx512f(auVar1);
      local_1e80 = vmovdqa64_avx512f(auVar1);
      local_1e84 = 1;
      auVar1 = vmovdqa64_avx512f(local_1e80);
      auVar1 = vpsrlw_avx512bw(auVar1,ZEXT416(1));
      auVar1 = vmovdqa64_avx512f(auVar1);
      auVar4 = vmovdqa64_avx512f(local_2d00);
      auVar2 = vmovdqa64_avx512f(auVar1);
      local_dc2 = 1;
      auVar3 = vpbroadcastw_avx512bw(ZEXT216(1));
      local_e40 = vmovdqa64_avx512f(auVar3);
      auVar3 = vmovdqa64_avx512f(local_e40);
      local_1680 = vmovdqa64_avx512f(auVar2);
      local_16c0 = vmovdqa64_avx512f(auVar3);
      auVar2 = vmovdqa64_avx512f(local_1680);
      auVar3 = vmovdqa64_avx512f(local_16c0);
      auVar2 = vpandq_avx512f(auVar2,auVar3);
      local_400 = vmovdqa64_avx512f(auVar4);
      local_440 = vmovdqa64_avx512f(auVar2);
      auVar4 = vmovdqa64_avx512f(local_400);
      auVar2 = vmovdqa64_avx512f(local_440);
      auVar4 = vpaddw_avx512bw(auVar4,auVar2);
      local_2d00 = vmovdqa64_avx512f(auVar4);
      auVar1 = vmovdqa64_avx512f(auVar1);
      local_1f00 = vmovdqa64_avx512f(auVar1);
      local_1f04 = 1;
      auVar1 = vmovdqa64_avx512f(local_1f00);
      auVar1 = vpsrlw_avx512bw(auVar1,ZEXT416(1));
      auVar1 = vmovdqa64_avx512f(auVar1);
      auVar4 = vmovdqa64_avx512f(local_2cc0);
      auVar2 = vmovdqa64_avx512f(auVar1);
      local_e42 = 1;
      auVar3 = vpbroadcastw_avx512bw(ZEXT216(1));
      local_ec0 = vmovdqa64_avx512f(auVar3);
      auVar3 = vmovdqa64_avx512f(local_ec0);
      local_1700 = vmovdqa64_avx512f(auVar2);
      local_1740 = vmovdqa64_avx512f(auVar3);
      auVar2 = vmovdqa64_avx512f(local_1700);
      auVar3 = vmovdqa64_avx512f(local_1740);
      auVar2 = vpandq_avx512f(auVar2,auVar3);
      local_480 = vmovdqa64_avx512f(auVar4);
      local_4c0 = vmovdqa64_avx512f(auVar2);
      auVar4 = vmovdqa64_avx512f(local_480);
      auVar2 = vmovdqa64_avx512f(local_4c0);
      auVar4 = vpaddw_avx512bw(auVar4,auVar2);
      local_2cc0 = vmovdqa64_avx512f(auVar4);
      auVar1 = vmovdqa64_avx512f(auVar1);
      local_1f80 = vmovdqa64_avx512f(auVar1);
      local_1f84 = 1;
      auVar1 = vmovdqa64_avx512f(local_1f80);
      auVar1 = vpsrlw_avx512bw(auVar1,ZEXT416(1));
      auVar1 = vmovdqa64_avx512f(auVar1);
      auVar4 = vmovdqa64_avx512f(local_2c80);
      auVar2 = vmovdqa64_avx512f(auVar1);
      local_ec2 = 1;
      auVar3 = vpbroadcastw_avx512bw(ZEXT216(1));
      local_f40 = vmovdqa64_avx512f(auVar3);
      auVar3 = vmovdqa64_avx512f(local_f40);
      local_1780 = vmovdqa64_avx512f(auVar2);
      local_17c0 = vmovdqa64_avx512f(auVar3);
      auVar2 = vmovdqa64_avx512f(local_1780);
      auVar3 = vmovdqa64_avx512f(local_17c0);
      auVar2 = vpandq_avx512f(auVar2,auVar3);
      local_500 = vmovdqa64_avx512f(auVar4);
      local_540 = vmovdqa64_avx512f(auVar2);
      auVar4 = vmovdqa64_avx512f(local_500);
      auVar2 = vmovdqa64_avx512f(local_540);
      auVar4 = vpaddw_avx512bw(auVar4,auVar2);
      local_2c80 = vmovdqa64_avx512f(auVar4);
      auVar1 = vmovdqa64_avx512f(auVar1);
      local_2000 = vmovdqa64_avx512f(auVar1);
      local_2004 = 1;
      auVar1 = vmovdqa64_avx512f(local_2000);
      auVar1 = vpsrlw_avx512bw(auVar1,ZEXT416(1));
      auVar1 = vmovdqa64_avx512f(auVar1);
      auVar4 = vmovdqa64_avx512f(local_2c40);
      auVar2 = vmovdqa64_avx512f(auVar1);
      local_f42 = 1;
      auVar3 = vpbroadcastw_avx512bw(ZEXT216(1));
      local_fc0 = vmovdqa64_avx512f(auVar3);
      auVar3 = vmovdqa64_avx512f(local_fc0);
      local_1800 = vmovdqa64_avx512f(auVar2);
      local_1840 = vmovdqa64_avx512f(auVar3);
      auVar2 = vmovdqa64_avx512f(local_1800);
      auVar3 = vmovdqa64_avx512f(local_1840);
      auVar2 = vpandq_avx512f(auVar2,auVar3);
      local_580 = vmovdqa64_avx512f(auVar4);
      local_5c0 = vmovdqa64_avx512f(auVar2);
      auVar4 = vmovdqa64_avx512f(local_580);
      auVar2 = vmovdqa64_avx512f(local_5c0);
      auVar4 = vpaddw_avx512bw(auVar4,auVar2);
      local_2c40 = vmovdqa64_avx512f(auVar4);
      auVar1 = vmovdqa64_avx512f(auVar1);
      local_2080 = vmovdqa64_avx512f(auVar1);
      local_2084 = 1;
      auVar1 = vmovdqa64_avx512f(local_2080);
      auVar1 = vpsrlw_avx512bw(auVar1,ZEXT416(1));
      auVar1 = vmovdqa64_avx512f(auVar1);
      auVar4 = vmovdqa64_avx512f(local_2c00);
      auVar2 = vmovdqa64_avx512f(auVar1);
      local_fc2 = 1;
      auVar3 = vpbroadcastw_avx512bw(ZEXT216(1));
      local_1040 = vmovdqa64_avx512f(auVar3);
      auVar3 = vmovdqa64_avx512f(local_1040);
      local_1880 = vmovdqa64_avx512f(auVar2);
      local_18c0 = vmovdqa64_avx512f(auVar3);
      auVar2 = vmovdqa64_avx512f(local_1880);
      auVar3 = vmovdqa64_avx512f(local_18c0);
      auVar2 = vpandq_avx512f(auVar2,auVar3);
      local_600 = vmovdqa64_avx512f(auVar4);
      local_640 = vmovdqa64_avx512f(auVar2);
      auVar4 = vmovdqa64_avx512f(local_600);
      auVar2 = vmovdqa64_avx512f(local_640);
      auVar4 = vpaddw_avx512bw(auVar4,auVar2);
      local_2c00 = vmovdqa64_avx512f(auVar4);
      auVar1 = vmovdqa64_avx512f(auVar1);
      local_2100 = vmovdqa64_avx512f(auVar1);
      local_2104 = 1;
      auVar1 = vmovdqa64_avx512f(local_2100);
      auVar1 = vpsrlw_avx512bw(auVar1,ZEXT416(1));
      auVar1 = vmovdqa64_avx512f(auVar1);
      auVar4 = vmovdqa64_avx512f(local_2bc0);
      auVar2 = vmovdqa64_avx512f(auVar1);
      local_1042 = 1;
      auVar3 = vpbroadcastw_avx512bw(ZEXT216(1));
      local_10c0 = vmovdqa64_avx512f(auVar3);
      auVar3 = vmovdqa64_avx512f(local_10c0);
      local_1900 = vmovdqa64_avx512f(auVar2);
      local_1940 = vmovdqa64_avx512f(auVar3);
      auVar2 = vmovdqa64_avx512f(local_1900);
      auVar3 = vmovdqa64_avx512f(local_1940);
      auVar2 = vpandq_avx512f(auVar2,auVar3);
      local_680 = vmovdqa64_avx512f(auVar4);
      local_6c0 = vmovdqa64_avx512f(auVar2);
      auVar4 = vmovdqa64_avx512f(local_680);
      auVar2 = vmovdqa64_avx512f(local_6c0);
      auVar4 = vpaddw_avx512bw(auVar4,auVar2);
      local_2bc0 = vmovdqa64_avx512f(auVar4);
      auVar1 = vmovdqa64_avx512f(auVar1);
      local_2180 = vmovdqa64_avx512f(auVar1);
      local_2184 = 1;
      auVar1 = vmovdqa64_avx512f(local_2180);
      auVar1 = vpsrlw_avx512bw(auVar1,ZEXT416(1));
      auVar1 = vmovdqa64_avx512f(auVar1);
      auVar4 = vmovdqa64_avx512f(local_2b80);
      auVar2 = vmovdqa64_avx512f(auVar1);
      local_10c2 = 1;
      auVar3 = vpbroadcastw_avx512bw(ZEXT216(1));
      local_1140 = vmovdqa64_avx512f(auVar3);
      auVar3 = vmovdqa64_avx512f(local_1140);
      local_1980 = vmovdqa64_avx512f(auVar2);
      local_19c0 = vmovdqa64_avx512f(auVar3);
      auVar2 = vmovdqa64_avx512f(local_1980);
      auVar3 = vmovdqa64_avx512f(local_19c0);
      auVar2 = vpandq_avx512f(auVar2,auVar3);
      local_700 = vmovdqa64_avx512f(auVar4);
      local_740 = vmovdqa64_avx512f(auVar2);
      auVar4 = vmovdqa64_avx512f(local_700);
      auVar2 = vmovdqa64_avx512f(local_740);
      auVar4 = vpaddw_avx512bw(auVar4,auVar2);
      local_2b80 = vmovdqa64_avx512f(auVar4);
      auVar1 = vmovdqa64_avx512f(auVar1);
      local_2200 = vmovdqa64_avx512f(auVar1);
      local_2204 = 1;
      auVar1 = vmovdqa64_avx512f(local_2200);
      auVar1 = vpsrlw_avx512bw(auVar1,ZEXT416(1));
      auVar1 = vmovdqa64_avx512f(auVar1);
      auVar4 = vmovdqa64_avx512f(local_2b40);
      auVar2 = vmovdqa64_avx512f(auVar1);
      local_1142 = 1;
      auVar3 = vpbroadcastw_avx512bw(ZEXT216(1));
      local_11c0 = vmovdqa64_avx512f(auVar3);
      auVar3 = vmovdqa64_avx512f(local_11c0);
      local_1a00 = vmovdqa64_avx512f(auVar2);
      local_1a40 = vmovdqa64_avx512f(auVar3);
      auVar2 = vmovdqa64_avx512f(local_1a00);
      auVar3 = vmovdqa64_avx512f(local_1a40);
      auVar2 = vpandq_avx512f(auVar2,auVar3);
      local_780 = vmovdqa64_avx512f(auVar4);
      local_7c0 = vmovdqa64_avx512f(auVar2);
      auVar4 = vmovdqa64_avx512f(local_780);
      auVar2 = vmovdqa64_avx512f(local_7c0);
      auVar4 = vpaddw_avx512bw(auVar4,auVar2);
      local_2b40 = vmovdqa64_avx512f(auVar4);
      auVar1 = vmovdqa64_avx512f(auVar1);
      local_2280 = vmovdqa64_avx512f(auVar1);
      local_2284 = 1;
      auVar1 = vmovdqa64_avx512f(local_2280);
      auVar1 = vpsrlw_avx512bw(auVar1,ZEXT416(1));
      auVar1 = vmovdqa64_avx512f(auVar1);
      auVar4 = vmovdqa64_avx512f(local_2b00);
      auVar2 = vmovdqa64_avx512f(auVar1);
      local_11c2 = 1;
      auVar3 = vpbroadcastw_avx512bw(ZEXT216(1));
      local_1240 = vmovdqa64_avx512f(auVar3);
      auVar3 = vmovdqa64_avx512f(local_1240);
      local_1a80 = vmovdqa64_avx512f(auVar2);
      local_1ac0 = vmovdqa64_avx512f(auVar3);
      auVar2 = vmovdqa64_avx512f(local_1a80);
      auVar3 = vmovdqa64_avx512f(local_1ac0);
      auVar2 = vpandq_avx512f(auVar2,auVar3);
      local_800 = vmovdqa64_avx512f(auVar4);
      local_840 = vmovdqa64_avx512f(auVar2);
      auVar4 = vmovdqa64_avx512f(local_800);
      auVar2 = vmovdqa64_avx512f(local_840);
      auVar4 = vpaddw_avx512bw(auVar4,auVar2);
      local_2b00 = vmovdqa64_avx512f(auVar4);
      auVar1 = vmovdqa64_avx512f(auVar1);
      local_2300 = vmovdqa64_avx512f(auVar1);
      local_2304 = 1;
      auVar1 = vmovdqa64_avx512f(local_2300);
      auVar1 = vpsrlw_avx512bw(auVar1,ZEXT416(1));
      auVar1 = vmovdqa64_avx512f(auVar1);
      auVar4 = vmovdqa64_avx512f(local_2ac0);
      auVar2 = vmovdqa64_avx512f(auVar1);
      local_1242 = 1;
      auVar3 = vpbroadcastw_avx512bw(ZEXT216(1));
      local_12c0 = vmovdqa64_avx512f(auVar3);
      auVar3 = vmovdqa64_avx512f(local_12c0);
      local_1b00 = vmovdqa64_avx512f(auVar2);
      local_1b40 = vmovdqa64_avx512f(auVar3);
      auVar2 = vmovdqa64_avx512f(local_1b00);
      auVar3 = vmovdqa64_avx512f(local_1b40);
      auVar2 = vpandq_avx512f(auVar2,auVar3);
      local_880 = vmovdqa64_avx512f(auVar4);
      local_8c0 = vmovdqa64_avx512f(auVar2);
      auVar4 = vmovdqa64_avx512f(local_880);
      auVar2 = vmovdqa64_avx512f(local_8c0);
      auVar4 = vpaddw_avx512bw(auVar4,auVar2);
      local_2ac0 = vmovdqa64_avx512f(auVar4);
      auVar1 = vmovdqa64_avx512f(auVar1);
      local_2380 = vmovdqa64_avx512f(auVar1);
      local_2384 = 1;
      auVar1 = vmovdqa64_avx512f(local_2380);
      auVar1 = vpsrlw_avx512bw(auVar1,ZEXT416(1));
      auVar1 = vmovdqa64_avx512f(auVar1);
      auVar4 = vmovdqa64_avx512f(local_2a80);
      auVar2 = vmovdqa64_avx512f(auVar1);
      local_12c2 = 1;
      auVar3 = vpbroadcastw_avx512bw(ZEXT216(1));
      local_1340 = vmovdqa64_avx512f(auVar3);
      auVar3 = vmovdqa64_avx512f(local_1340);
      local_1b80 = vmovdqa64_avx512f(auVar2);
      local_1bc0 = vmovdqa64_avx512f(auVar3);
      auVar2 = vmovdqa64_avx512f(local_1b80);
      auVar3 = vmovdqa64_avx512f(local_1bc0);
      auVar2 = vpandq_avx512f(auVar2,auVar3);
      local_900 = vmovdqa64_avx512f(auVar4);
      local_940 = vmovdqa64_avx512f(auVar2);
      auVar4 = vmovdqa64_avx512f(local_900);
      auVar2 = vmovdqa64_avx512f(local_940);
      auVar4 = vpaddw_avx512bw(auVar4,auVar2);
      local_2a80 = vmovdqa64_avx512f(auVar4);
      auVar1 = vmovdqa64_avx512f(auVar1);
      local_2400 = vmovdqa64_avx512f(auVar1);
      local_2404 = 1;
      auVar1 = vmovdqa64_avx512f(local_2400);
      auVar1 = vpsrlw_avx512bw(auVar1,ZEXT416(1));
      auVar1 = vmovdqa64_avx512f(auVar1);
      auVar4 = vmovdqa64_avx512f(local_2a40);
      auVar2 = vmovdqa64_avx512f(auVar1);
      local_1342 = 1;
      auVar3 = vpbroadcastw_avx512bw(ZEXT216(1));
      local_13c0 = vmovdqa64_avx512f(auVar3);
      auVar3 = vmovdqa64_avx512f(local_13c0);
      local_1c00 = vmovdqa64_avx512f(auVar2);
      local_1c40 = vmovdqa64_avx512f(auVar3);
      auVar2 = vmovdqa64_avx512f(local_1c00);
      auVar3 = vmovdqa64_avx512f(local_1c40);
      auVar2 = vpandq_avx512f(auVar2,auVar3);
      local_980 = vmovdqa64_avx512f(auVar4);
      local_9c0 = vmovdqa64_avx512f(auVar2);
      auVar4 = vmovdqa64_avx512f(local_980);
      auVar2 = vmovdqa64_avx512f(local_9c0);
      auVar4 = vpaddw_avx512bw(auVar4,auVar2);
      local_2a40 = vmovdqa64_avx512f(auVar4);
      auVar1 = vmovdqa64_avx512f(auVar1);
      local_2480 = vmovdqa64_avx512f(auVar1);
      local_2484 = 1;
      auVar1 = vmovdqa64_avx512f(local_2480);
      auVar1 = vpsrlw_avx512bw(auVar1,ZEXT416(1));
      auVar1 = vmovdqa64_avx512f(auVar1);
      auVar4 = vmovdqa64_avx512f(local_2a00);
      auVar2 = vmovdqa64_avx512f(auVar1);
      local_13c2 = 1;
      auVar3 = vpbroadcastw_avx512bw(ZEXT216(1));
      local_1440 = vmovdqa64_avx512f(auVar3);
      auVar3 = vmovdqa64_avx512f(local_1440);
      local_1c80 = vmovdqa64_avx512f(auVar2);
      local_1cc0 = vmovdqa64_avx512f(auVar3);
      auVar2 = vmovdqa64_avx512f(local_1c80);
      auVar3 = vmovdqa64_avx512f(local_1cc0);
      auVar2 = vpandq_avx512f(auVar2,auVar3);
      local_a00 = vmovdqa64_avx512f(auVar4);
      local_a40 = vmovdqa64_avx512f(auVar2);
      auVar4 = vmovdqa64_avx512f(local_a00);
      auVar2 = vmovdqa64_avx512f(local_a40);
      auVar4 = vpaddw_avx512bw(auVar4,auVar2);
      local_2a00 = vmovdqa64_avx512f(auVar4);
      auVar1 = vmovdqa64_avx512f(auVar1);
      local_2500 = vmovdqa64_avx512f(auVar1);
      local_2504 = 1;
      auVar1 = vmovdqa64_avx512f(local_2500);
      auVar1 = vpsrlw_avx512bw(auVar1,ZEXT416(1));
      auVar1 = vmovdqa64_avx512f(auVar1);
      auVar4 = vmovdqa64_avx512f(local_29c0);
      auVar2 = vmovdqa64_avx512f(auVar1);
      local_1442 = 1;
      auVar3 = vpbroadcastw_avx512bw(ZEXT216(1));
      local_14c0 = vmovdqa64_avx512f(auVar3);
      auVar3 = vmovdqa64_avx512f(local_14c0);
      local_1d00 = vmovdqa64_avx512f(auVar2);
      local_1d40 = vmovdqa64_avx512f(auVar3);
      auVar2 = vmovdqa64_avx512f(local_1d00);
      auVar2 = vpandq_avx512f(auVar2,local_1d40);
      local_a80 = vmovdqa64_avx512f(auVar4);
      local_ac0 = vmovdqa64_avx512f(auVar2);
      auVar4 = vmovdqa64_avx512f(local_a80);
      auVar2 = vmovdqa64_avx512f(local_ac0);
      auVar4 = vpaddw_avx512bw(auVar4,auVar2);
      local_29c0 = vmovdqa64_avx512f(auVar4);
      auVar1 = vmovdqa64_avx512f(auVar1);
      local_2580 = vmovdqa64_avx512f(auVar1);
      local_2584 = 1;
      auVar1 = vmovdqa64_avx512f(local_2580);
      auVar1 = vpsrlw_avx512bw(auVar1,ZEXT416(1));
      local_2800 = vmovdqa64_avx512f(auVar1);
      vmovdqa64_avx512f(local_2940);
      vmovdqa64_avx512f(local_2980);
      b_13[1]._0_4_ = in_stack_ffffffffffffd1c0;
      b_13[0] = (longlong)in_stack_ffffffffffffd1b8;
      b_13[1]._4_4_ = in_stack_ffffffffffffd1c4;
      b_13[2] = in_stack_ffffffffffffd1c8;
      b_13[3]._0_4_ = in_stack_ffffffffffffd1d0;
      b_13[3]._4_4_ = in_stack_ffffffffffffd1d4;
      b_13[4] = in_stack_ffffffffffffd1d8;
      b_13[5]._0_4_ = in_stack_ffffffffffffd1e0;
      b_13[5]._4_4_ = in_stack_ffffffffffffd1e4;
      b_13[6] = in_stack_ffffffffffffd1e8;
      b_13[7]._0_4_ = in_stack_ffffffffffffd1f0;
      b_13[7]._4_4_ = in_stack_ffffffffffffd1f4;
      c_13[1] = in_stack_ffffffffffffd180;
      c_13[0] = 0x151311;
      c_13[2] = (longlong)in_stack_ffffffffffffd188;
      c_13[3] = (longlong)puVar5;
      c_13[4] = (longlong)in_stack_ffffffffffffd198;
      c_13[5] = (longlong)puVar6;
      c_13[6] = (longlong)in_stack_ffffffffffffd1a8;
      c_13[7] = (longlong)in_stack_ffffffffffffd1b0;
      pospopcnt_csa_avx512(h,(__m512i *)l,b_13,c_13);
    }
    for (local_2df0 = 0; local_2df0 < 0x10; local_2df0 = local_2df0 + 1) {
      auVar1 = vmovdqa64_avx512f(*(undefined1 (*) [64])(local_2d80 + local_2df0 * 0x40));
      auVar4 = vmovdqa64_avx512f(local_2800);
      local_14c2 = 1;
      auVar2 = vpbroadcastw_avx512bw(ZEXT216(1));
      local_1540 = vmovdqa64_avx512f(auVar2);
      auVar2 = vmovdqa64_avx512f(local_1540);
      local_1d80 = vmovdqa64_avx512f(auVar4);
      local_1dc0 = vmovdqa64_avx512f(auVar2);
      auVar4 = vmovdqa64_avx512f(local_1d80);
      auVar4 = vpandq_avx512f(auVar4,local_1dc0);
      local_b00 = vmovdqa64_avx512f(auVar1);
      local_b40 = vmovdqa64_avx512f(auVar4);
      auVar1 = vmovdqa64_avx512f(local_b00);
      auVar4 = vmovdqa64_avx512f(local_b40);
      auVar1 = vpaddw_avx512bw(auVar1,auVar4);
      auVar1 = vmovdqa64_avx512f(auVar1);
      *(undefined1 (*) [64])(local_2d80 + local_2df0 * 0x40) = auVar1;
      auVar1 = vmovdqa64_avx512f(local_2800);
      local_2600 = vmovdqa64_avx512f(auVar1);
      local_2604 = 1;
      auVar1 = vmovdqa64_avx512f(local_2600);
      auVar1 = vpsrlw_avx512bw(auVar1,ZEXT416(1));
      local_2800 = vmovdqa64_avx512f(auVar1);
    }
    for (local_2df8 = 0; local_2df8 < 0x10; local_2df8 = local_2df8 + 1) {
      local_58 = local_2dd0;
      auVar1 = vmovdqa64_avx512f(*(undefined1 (*) [64])(local_2d80 + local_2df8 * 0x40));
      local_c0 = vmovdqa64_avx512f(auVar1);
      auVar1 = vmovdqa64_avx512f(local_c0);
      local_2dd0 = vmovdqu64_avx512f(auVar1);
      for (local_2e00 = 0; local_2e00 < 0x20; local_2e00 = local_2e00 + 1) {
        *(uint *)(local_26a0 + local_2df8 * 4) =
             (uint)*(ushort *)(local_2dd0 + local_2e00 * 2) * 0x10 +
             *(int *)(local_26a0 + local_2df8 * 4);
      }
    }
  }
  auVar1 = vmovdqa64_avx512f(local_2700);
  auVar1 = vmovdqa64_avx512f(auVar1);
  auVar1 = vmovdqa64_avx512f(auVar1);
  local_2dd0 = vmovdqu64_avx512f(auVar1);
  for (local_2e08 = 0; local_2e08 < 0x20; local_2e08 = local_2e08 + 1) {
    for (iVar8 = 0; iVar8 < 0x10; iVar8 = iVar8 + 1) {
      *(int *)(local_26a0 + (long)iVar8 * 4) =
           ((int)((uint)*(ushort *)(local_2dd0 + local_2e08 * 2) & 1 << ((byte)iVar8 & 0x1f)) >>
           ((byte)iVar8 & 0x1f)) + *(int *)(local_26a0 + (long)iVar8 * 4);
    }
  }
  auVar1 = vmovdqa64_avx512f(local_2740);
  auVar1 = vmovdqa64_avx512f(auVar1);
  auVar1 = vmovdqa64_avx512f(auVar1);
  local_2dd0 = vmovdqu64_avx512f(auVar1);
  for (uVar7 = 0; uVar7 < 0x20; uVar7 = uVar7 + 1) {
    for (iVar8 = 0; iVar8 < 0x10; iVar8 = iVar8 + 1) {
      *(int *)(local_26a0 + (long)iVar8 * 4) =
           ((int)((uint)*(ushort *)(local_2dd0 + uVar7 * 2) & 1 << ((byte)iVar8 & 0x1f)) >>
           ((byte)iVar8 & 0x1f)) * 2 + *(int *)(local_26a0 + (long)iVar8 * 4);
    }
  }
  auVar1 = vmovdqa64_avx512f(local_2780);
  auVar1 = vmovdqa64_avx512f(auVar1);
  auVar1 = vmovdqa64_avx512f(auVar1);
  local_2dd0 = vmovdqu64_avx512f(auVar1);
  for (uVar7 = 0; uVar7 < 0x20; uVar7 = uVar7 + 1) {
    for (iVar8 = 0; iVar8 < 0x10; iVar8 = iVar8 + 1) {
      *(int *)(local_26a0 + (long)iVar8 * 4) =
           ((int)((uint)*(ushort *)(local_2dd0 + uVar7 * 2) & 1 << ((byte)iVar8 & 0x1f)) >>
           ((byte)iVar8 & 0x1f)) * 4 + *(int *)(local_26a0 + (long)iVar8 * 4);
    }
  }
  auVar1 = vmovdqa64_avx512f(local_27c0);
  auVar1 = vmovdqa64_avx512f(auVar1);
  auVar1 = vmovdqa64_avx512f(auVar1);
  local_2dd0 = vmovdqu64_avx512f(auVar1);
  for (uVar7 = 0; uVar7 < 0x20; uVar7 = uVar7 + 1) {
    for (iVar8 = 0; iVar8 < 0x10; iVar8 = iVar8 + 1) {
      *(int *)(local_26a0 + (long)iVar8 * 4) =
           ((int)((uint)*(ushort *)(local_2dd0 + uVar7 * 2) & 1 << ((byte)iVar8 & 0x1f)) >>
           ((byte)iVar8 & 0x1f)) * 8 + *(int *)(local_26a0 + (long)iVar8 * 4);
    }
  }
  return 0;
}

Assistant:

int pospopcnt_u16_avx512bw_harley_seal(const uint16_t* array, uint32_t len, uint32_t* flags) {
    for (uint32_t i = len - (len % (32 * 16)); i < len; ++i) {
        for (int j = 0; j < 16; ++j) {
            flags[j] += ((array[i] & (1 << j)) >> j);
        }
    }

    const __m512i* data = (const __m512i*)array;
    __m512i v1  = _mm512_setzero_si512();
    __m512i v2  = _mm512_setzero_si512();
    __m512i v4  = _mm512_setzero_si512();
    __m512i v8  = _mm512_setzero_si512();
    __m512i v16 = _mm512_setzero_si512();
    __m512i twosA, twosB, foursA, foursB, eightsA, eightsB;
    __m512i counter[16];

    const size_t size = len / 32;
    const uint64_t limit = size - size % 16;

    uint16_t buffer[32];

    uint64_t i = 0;
    while (i < limit) {
        for (size_t i = 0; i < 16; ++i)
            counter[i] = _mm512_setzero_si512();

        size_t thislimit = limit;
        if (thislimit - i >= (1 << 16))
            thislimit = i + (1 << 16) - 1;

        for (/**/; i < thislimit; i += 16) {
#define U(pos) {                     \
    counter[pos] = _mm512_add_epi16(counter[pos], _mm512_and_si512(v16, _mm512_set1_epi16(1))); \
    v16 = _mm512_srli_epi16(v16, 1); \
}
            pospopcnt_csa_avx512(&twosA,   &v1, _mm512_loadu_si512(data + i + 0), _mm512_loadu_si512(data + i + 1));
            pospopcnt_csa_avx512(&twosB,   &v1, _mm512_loadu_si512(data + i + 2), _mm512_loadu_si512(data + i + 3));
            pospopcnt_csa_avx512(&foursA,  &v2, twosA, twosB);
            pospopcnt_csa_avx512(&twosA,   &v1, _mm512_loadu_si512(data + i + 4), _mm512_loadu_si512(data + i + 5));
            pospopcnt_csa_avx512(&twosB,   &v1, _mm512_loadu_si512(data + i + 6), _mm512_loadu_si512(data + i + 7));
            pospopcnt_csa_avx512(&foursB,  &v2, twosA, twosB);
            pospopcnt_csa_avx512(&eightsA, &v4, foursA, foursB);
            pospopcnt_csa_avx512(&twosA,   &v1, _mm512_loadu_si512(data + i + 8),  _mm512_loadu_si512(data + i + 9));
            pospopcnt_csa_avx512(&twosB,   &v1, _mm512_loadu_si512(data + i + 10), _mm512_loadu_si512(data + i + 11));
            pospopcnt_csa_avx512(&foursA,  &v2, twosA, twosB);
            pospopcnt_csa_avx512(&twosA,   &v1, _mm512_loadu_si512(data + i + 12), _mm512_loadu_si512(data + i + 13));
            pospopcnt_csa_avx512(&twosB,   &v1, _mm512_loadu_si512(data + i + 14), _mm512_loadu_si512(data + i + 15));
            pospopcnt_csa_avx512(&foursB,  &v2, twosA, twosB);
            pospopcnt_csa_avx512(&eightsB, &v4, foursA, foursB);
            U(0) U(1) U(2) U(3) U(4) U(5) U(6) U(7) U(8) U(9) U(10) U(11) U(12) U(13) U(14) U(15) // Updates
            pospopcnt_csa_avx512(&v16,     &v8, eightsA, eightsB);
        }
        // Update the counters after the last iteration.
        for (size_t i = 0; i < 16; ++i) U(i)
#undef U
        
        for (size_t i = 0; i < 16; ++i) {
            _mm512_storeu_si512((__m512i*)buffer, counter[i]);
            for (size_t z = 0; z < 32; z++) {
                flags[i] += 16 * (uint32_t)buffer[z];
            }
        }
    }

    _mm512_storeu_si512((__m512i*)buffer, v1);
    for (size_t i = 0; i < 32; i++) {
        for (int j = 0; j < 16; j++) {
            flags[j] += 1 * ((buffer[i] & (1 << j)) >> j);
        }
    }

    _mm512_storeu_si512((__m512i*)buffer, v2);
    for (size_t i = 0; i < 32; i++) {
        for (int j = 0; j < 16; j++) {
            flags[j] += 2 * ((buffer[i] & (1 << j)) >> j);
        }
    }
    
    _mm512_storeu_si512((__m512i*)buffer, v4);
    for (size_t i = 0; i < 32; i++) {
        for (int j = 0; j < 16; j++) {
            flags[j] += 4 * ((buffer[i] & (1 << j)) >> j);
        }
    }

    _mm512_storeu_si512((__m512i*)buffer, v8);
    for (size_t i = 0; i < 32; i++) {
        for (int j = 0; j < 16; j++) {
            flags[j] += 8 * ((buffer[i] & (1 << j)) >> j);
        }
    }
    return 0;
}